

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writer.cc
# Opt level: O2

bool __thiscall xsettingsd::DataWriter::WriteZeros(DataWriter *this,size_t bytes_to_write)

{
  ulong uVar1;
  
  uVar1 = this->buf_len_ - this->bytes_written_;
  if (bytes_to_write <= uVar1) {
    memset(this->buffer_ + this->bytes_written_,0,bytes_to_write);
    this->bytes_written_ = this->bytes_written_ + bytes_to_write;
  }
  return bytes_to_write <= uVar1;
}

Assistant:

bool DataWriter::WriteZeros(size_t bytes_to_write) {
  if (bytes_to_write > buf_len_ - bytes_written_)
    return false;

  bzero(buffer_ + bytes_written_,
        min(bytes_to_write, buf_len_ - bytes_written_));
  bytes_written_ += bytes_to_write;
  return true;
}